

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

uint16_t read_uint16(dwarf_buf *buf)

{
  uchar *puVar1;
  uint16_t uVar2;
  int iVar3;
  bool bVar4;
  
  puVar1 = buf->buf;
  iVar3 = advance(buf,2);
  if (iVar3 == 0) {
    uVar2 = 0;
  }
  else {
    bVar4 = buf->is_bigendian == 0;
    uVar2 = CONCAT11(puVar1[bVar4],puVar1[!bVar4]);
  }
  return uVar2;
}

Assistant:

static uint16_t
read_uint16 (struct dwarf_buf *buf)
{
  const unsigned char *p = buf->buf;

  if (!advance (buf, 2))
    return 0;
  if (buf->is_bigendian)
    return ((uint16_t) p[0] << 8) | (uint16_t) p[1];
  else
    return ((uint16_t) p[1] << 8) | (uint16_t) p[0];
}